

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_value_type_demotion.c
# Opt level: O3

value value_type_demotion_decimal(value v,type_id id)

{
  type_id id_00;
  int iVar1;
  value pvVar2;
  value pvVar3;
  
  id_00 = value_type_id(v);
  iVar1 = type_id_decimal(id_00);
  if (iVar1 == 0) {
    iVar1 = type_id_decimal(id);
    pvVar3 = (value)0x0;
    if (((id <= id_00) && (iVar1 == 0)) && (pvVar3 = v, id_00 != id)) {
      value_to_double(v);
      pvVar2 = value_create_float(0.0);
      if (pvVar2 != (value)0x0) {
        value_destroy(v);
        pvVar3 = pvVar2;
      }
    }
  }
  else {
    pvVar3 = (value)0x0;
  }
  return pvVar3;
}

Assistant:

value value_type_demotion_decimal(value v, type_id id)
{
	struct
	{
		float f;
		double d;
	} decimal_demotion;

	value demotion = NULL;

	type_id v_id = value_type_id(v);

	if (type_id_decimal(v_id) != 0 || type_id_decimal(id) != 0 || v_id < id)
	{
		return NULL;
	}

	if (v_id == id)
	{
		return v;
	}

	decimal_demotion.d = value_to_double(v);

	decimal_demotion.f = (float)decimal_demotion.d;

	demotion = value_create_float(decimal_demotion.f);

	if (demotion == NULL)
	{
		return v;
	}

	value_destroy(v);

	return demotion;
}